

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningHeuristics.h
# Opt level: O1

bool InliningHeuristics::IsInlineeLeaf(FunctionJITTimeInfo *inlinee)

{
  bool bVar1;
  ProfileId PVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *pJVar3;
  JITTimeProfileInfo *this;
  
  pJVar3 = FunctionJITTimeInfo::GetBody(inlinee);
  bVar1 = JITTimeFunctionBody::HasProfileInfo(pJVar3);
  if (bVar1) {
    sourceContextId = FunctionJITTimeInfo::GetSourceContextId(inlinee);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(inlinee);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,InlineBuiltInCallerPhase,sourceContextId,functionId);
    pJVar3 = FunctionJITTimeInfo::GetBody(inlinee);
    if (bVar1) {
      PVar2 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar3);
      if (PVar2 == 0) {
LAB_00566f3d:
        pJVar3 = FunctionJITTimeInfo::GetBody(inlinee);
        this = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar3);
        bVar1 = JITTimeProfileInfo::HasLdFldCallSiteInfo(this);
        return !bVar1;
      }
    }
    else {
      bVar1 = JITTimeFunctionBody::HasNonBuiltInCallee(pJVar3);
      if (!bVar1) goto LAB_00566f3d;
    }
  }
  return false;
}

Assistant:

static bool IsInlineeLeaf(const FunctionJITTimeInfo * inlinee)
    {
        return inlinee->GetBody()->HasProfileInfo()
            && (!PHASE_OFF(Js::InlineBuiltInCallerPhase, inlinee) ? !inlinee->GetBody()->HasNonBuiltInCallee() : inlinee->GetBody()->GetProfiledCallSiteCount() == 0)
            && !inlinee->GetBody()->GetReadOnlyProfileInfo()->HasLdFldCallSiteInfo();
    }